

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

char * deqp::egl::anon_unknown_7::configAttributeToString(EGLint e)

{
  char *pcStack_10;
  EGLint e_local;
  
  switch(e) {
  case 0x3020:
    pcStack_10 = "EGL_BUFFER_SIZE";
    break;
  case 0x3021:
    pcStack_10 = "EGL_ALPHA_SIZE";
    break;
  case 0x3022:
    pcStack_10 = "EGL_BLUE_SIZE";
    break;
  case 0x3023:
    pcStack_10 = "EGL_GREEN_SIZE";
    break;
  case 0x3024:
    pcStack_10 = "EGL_RED_SIZE";
    break;
  case 0x3025:
    pcStack_10 = "EGL_DEPTH_SIZE";
    break;
  case 0x3026:
    pcStack_10 = "EGL_STENCIL_SIZE";
    break;
  case 0x3027:
    pcStack_10 = "EGL_CONFIG_CAVEAT";
    break;
  case 0x3028:
    pcStack_10 = "EGL_CONFIG_ID";
    break;
  case 0x3029:
    pcStack_10 = "EGL_LEVEL";
    break;
  case 0x302a:
    pcStack_10 = "EGL_MAX_PBUFFER_HEIGHT";
    break;
  case 0x302b:
    pcStack_10 = "EGL_MAX_PBUFFER_PIXELS";
    break;
  case 0x302c:
    pcStack_10 = "EGL_MAX_PBUFFER_WIDTH";
    break;
  case 0x302d:
    pcStack_10 = "EGL_NATIVE_RENDERABLE";
    break;
  case 0x302e:
    pcStack_10 = "EGL_NATIVE_VISUAL_ID";
    break;
  case 0x302f:
    pcStack_10 = "EGL_NATIVE_VISUAL_TYPE";
    break;
  default:
    pcStack_10 = "<Unknown>";
    break;
  case 0x3031:
    pcStack_10 = "EGL_SAMPLES";
    break;
  case 0x3032:
    pcStack_10 = "EGL_SAMPLE_BUFFERS";
    break;
  case 0x3033:
    pcStack_10 = "EGL_SURFACE_TYPE";
    break;
  case 0x3034:
    pcStack_10 = "EGL_TRANSPARENT_TYPE";
    break;
  case 0x3035:
    pcStack_10 = "EGL_TRANSPARENT_BLUE_VALUE";
    break;
  case 0x3036:
    pcStack_10 = "EGL_TRANSPARENT_GREEN_VALUE";
    break;
  case 0x3037:
    pcStack_10 = "EGL_TRANSPARENT_RED_VALUE";
    break;
  case 0x3039:
    pcStack_10 = "EGL_BIND_TO_TEXTURE_RGB";
    break;
  case 0x303a:
    pcStack_10 = "EGL_BIND_TO_TEXTURE_RGBA";
    break;
  case 0x303b:
    pcStack_10 = "EGL_MIN_SWAP_INTERVAL";
    break;
  case 0x303c:
    pcStack_10 = "EGL_MAX_SWAP_INTERVAL";
    break;
  case 0x303d:
    pcStack_10 = "EGL_LUMINANCE_SIZE";
    break;
  case 0x303e:
    pcStack_10 = "EGL_ALPHA_MASK_SIZE";
    break;
  case 0x303f:
    pcStack_10 = "EGL_COLOR_BUFFER_TYPE";
    break;
  case 0x3040:
    pcStack_10 = "EGL_RENDERABLE_TYPE";
    break;
  case 0x3042:
    pcStack_10 = "EGL_CONFORMANT";
  }
  return pcStack_10;
}

Assistant:

const char* configAttributeToString (EGLint e)
{
	switch (e)
	{
		case EGL_BUFFER_SIZE:				return "EGL_BUFFER_SIZE";
		case EGL_RED_SIZE:					return "EGL_RED_SIZE";
		case EGL_GREEN_SIZE:				return "EGL_GREEN_SIZE";
		case EGL_BLUE_SIZE:					return "EGL_BLUE_SIZE";
		case EGL_LUMINANCE_SIZE:			return "EGL_LUMINANCE_SIZE";
		case EGL_ALPHA_SIZE:				return "EGL_ALPHA_SIZE";
		case EGL_ALPHA_MASK_SIZE:			return "EGL_ALPHA_MASK_SIZE";
		case EGL_BIND_TO_TEXTURE_RGB:		return "EGL_BIND_TO_TEXTURE_RGB";
		case EGL_BIND_TO_TEXTURE_RGBA:		return "EGL_BIND_TO_TEXTURE_RGBA";
		case EGL_COLOR_BUFFER_TYPE:			return "EGL_COLOR_BUFFER_TYPE";
		case EGL_CONFIG_CAVEAT:				return "EGL_CONFIG_CAVEAT";
		case EGL_CONFIG_ID:					return "EGL_CONFIG_ID";
		case EGL_CONFORMANT:				return "EGL_CONFORMANT";
		case EGL_DEPTH_SIZE:				return "EGL_DEPTH_SIZE";
		case EGL_LEVEL:						return "EGL_LEVEL";
		case EGL_MAX_PBUFFER_WIDTH:			return "EGL_MAX_PBUFFER_WIDTH";
		case EGL_MAX_PBUFFER_HEIGHT:		return "EGL_MAX_PBUFFER_HEIGHT";
		case EGL_MAX_PBUFFER_PIXELS:		return "EGL_MAX_PBUFFER_PIXELS";
		case EGL_MAX_SWAP_INTERVAL:			return "EGL_MAX_SWAP_INTERVAL";
		case EGL_MIN_SWAP_INTERVAL:			return "EGL_MIN_SWAP_INTERVAL";
		case EGL_NATIVE_RENDERABLE:			return "EGL_NATIVE_RENDERABLE";
		case EGL_NATIVE_VISUAL_ID:			return "EGL_NATIVE_VISUAL_ID";
		case EGL_NATIVE_VISUAL_TYPE:		return "EGL_NATIVE_VISUAL_TYPE";
		case EGL_RENDERABLE_TYPE:			return "EGL_RENDERABLE_TYPE";
		case EGL_SAMPLE_BUFFERS:			return "EGL_SAMPLE_BUFFERS";
		case EGL_SAMPLES:					return "EGL_SAMPLES";
		case EGL_STENCIL_SIZE:				return "EGL_STENCIL_SIZE";
		case EGL_SURFACE_TYPE:				return "EGL_SURFACE_TYPE";
		case EGL_TRANSPARENT_TYPE:			return "EGL_TRANSPARENT_TYPE";
		case EGL_TRANSPARENT_RED_VALUE:		return "EGL_TRANSPARENT_RED_VALUE";
		case EGL_TRANSPARENT_GREEN_VALUE:	return "EGL_TRANSPARENT_GREEN_VALUE";
		case EGL_TRANSPARENT_BLUE_VALUE:	return "EGL_TRANSPARENT_BLUE_VALUE";
		default:							return "<Unknown>";
	}
}